

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

double bernoulli_pdf(int x,double a)

{
  double dVar1;
  
  dVar1 = 0.0;
  if (((-1 < x) && (dVar1 = a, x != 1)) && (dVar1 = 0.0, x == 0)) {
    return 1.0 - a;
  }
  return dVar1;
}

Assistant:

double bernoulli_pdf ( int x, double a )

//****************************************************************************80
//
//  Purpose:
//
//    BERNOULLI_PDF evaluates the Bernoulli PDF.
//
//  Formula:
//
//    PDF(X)(A) = A^X * ( 1.0 - A )^( X - 1 )
//
//    X = 0 or 1.
//
//  Discussion:
//
//    The Bernoulli PDF describes the simple case in which a single trial
//    is carried out, with two possible outcomes, called "success" and
//    "failure"; the probability of success is A.
//
//  Modified:
//
//    22 May 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int X, the number of successes on a single trial.
//    X = 0 or 1.
//
//    Input, double A, the probability of success on one trial.
//    0.0 <= A <= 1.0.
//
//    Output, double BERNOULLI_PDF, the value of the PDF.
//
{
  double pdf;

  if ( x < 0 )
  {
    pdf = 0.0;
  }
  else if ( x == 0 )
  {
    pdf = 1.0 - a;
  }
  else if ( x == 1 )
  {
    pdf = a;
  }
  else
  {
    pdf = 0.0;
  }

  return pdf;
}